

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall randomx::Instruction::h_IROL_R(Instruction *this,ostream *os)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = this->dst & 7;
  uVar3 = this->src & 7;
  if ((char)uVar2 == (char)uVar3) {
    poVar1 = std::operator<<(os,"r");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  else {
    poVar1 = std::operator<<(os,"r");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
    poVar1 = std::operator<<(poVar1,", r");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Instruction::h_IROL_R(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		if (dstIndex != srcIndex) {
			os << "r" << dstIndex << ", r" << srcIndex << std::endl;
		}
		else {
			os << "r" << dstIndex << ", " << (getImm32() & 63) << std::endl;
		}
	}